

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

void __thiscall llvm::APFloat::makeNaN(APFloat *this,bool SNaN,bool Neg,APInt *fill)

{
  if ((this->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    detail::IEEEFloat::makeNaN(&(this->U).IEEE,SNaN,Neg,fill);
    return;
  }
  detail::DoubleAPFloat::makeNaN((DoubleAPFloat *)&(this->U).IEEE,SNaN,Neg,fill);
  return;
}

Assistant:

void makeNaN(bool SNaN, bool Neg, const APInt *fill) {
    APFLOAT_DISPATCH_ON_SEMANTICS(makeNaN(SNaN, Neg, fill));
  }